

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WFXMLScanner.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::WFXMLScanner::scanContent(WFXMLScanner *this)

{
  XMLSize_t XVar1;
  bool bVar2;
  XMLTokens XVar3;
  StackElem *pSVar4;
  XMLCh *text1;
  XMLSize_t XVar5;
  EndOfEntityException *toCatch;
  StackElem *topElem;
  XMLSize_t XStack_20;
  XMLTokens curToken;
  XMLSize_t orgReader;
  bool inMarkup;
  WFXMLScanner *pWStack_10;
  bool gotData;
  WFXMLScanner *this_local;
  
  orgReader._7_1_ = 1;
  orgReader._6_1_ = 0;
  pWStack_10 = this;
  while ((orgReader._7_1_ & 1) != 0) {
    while ((orgReader._7_1_ & 1) != 0) {
      XVar3 = XMLScanner::senseNextToken(&this->super_XMLScanner,&stack0xffffffffffffffe0);
      if (XVar3 == Token_CharData) {
        (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0xc])
                  (this,&(this->super_XMLScanner).fCDataBuf);
      }
      else if (XVar3 == Token_EOF) {
        bVar2 = ElemStack::isEmpty(&(this->super_XMLScanner).fElemStack);
        if (!bVar2) {
          pSVar4 = ElemStack::popTop(&(this->super_XMLScanner).fElemStack);
          text1 = XMLElementDecl::getFullName(pSVar4->fThisElement);
          XMLScanner::emitError
                    (&this->super_XMLScanner,EndedWithTagsOnStack,text1,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0);
        }
        orgReader._7_1_ = 0;
      }
      else {
        orgReader._6_1_ = 1;
        switch(XVar3) {
        case Token_CData:
          bVar2 = ElemStack::isEmpty(&(this->super_XMLScanner).fElemStack);
          if (bVar2) {
            XMLScanner::emitError(&this->super_XMLScanner,CDATAOutsideOfContent);
          }
          (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0xb])();
          break;
        default:
          ReaderMgr::skipToChar(&(this->super_XMLScanner).fReaderMgr,L'<');
          break;
        case Token_Comment:
          XMLScanner::scanComment(&this->super_XMLScanner);
          break;
        case Token_EndTag:
          scanEndTag(this,(bool *)((long)&orgReader + 7));
          break;
        case Token_PI:
          XMLScanner::scanPI(&this->super_XMLScanner);
          break;
        case Token_StartTag:
          if (((this->super_XMLScanner).fDoNamespaces & 1U) == 0) {
            scanStartTag(this,(bool *)((long)&orgReader + 7));
          }
          else {
            scanStartTagNS(this,(bool *)((long)&orgReader + 7));
          }
        }
        XVar1 = XStack_20;
        XVar5 = ReaderMgr::getCurrentReaderNum(&(this->super_XMLScanner).fReaderMgr);
        if (XVar1 != XVar5) {
          XMLScanner::emitError(&this->super_XMLScanner,PartialMarkupInEntity);
        }
        orgReader._6_1_ = 0;
      }
    }
  }
  return true;
}

Assistant:

bool WFXMLScanner::scanContent()
{
    //  Go into a loop until we hit the end of the root element, or we fall
    //  out because there is no root element.
    //
    //  We have to do kind of a deeply nested double loop here in order to
    //  avoid doing the setup/teardown of the exception handler on each
    //  round. Doing it this way we only do it when an exception actually
    //  occurs.
    bool gotData = true;
    bool inMarkup = false;
    while (gotData)
    {
        try
        {
            while (gotData)
            {
                //  Sense what the next top level token is. According to what
                //  this tells us, we will call something to handle that kind
                //  of thing.
                XMLSize_t orgReader;
                const XMLTokens curToken = senseNextToken(orgReader);

                //  Handle character data and end of file specially. Char data
                //  is not markup so we don't want to handle it in the loop
                //  below.
                if (curToken == Token_CharData)
                {
                    //  Scan the character data and call appropriate events. Let
                    //  him use our local character data buffer for efficiency.
                    scanCharData(fCDataBuf);
                    continue;
                }
                else if (curToken == Token_EOF)
                {
                    //  The element stack better be empty at this point or we
                    //  ended prematurely before all elements were closed.
                    if (!fElemStack.isEmpty())
                    {
                        const ElemStack::StackElem* topElem = fElemStack.popTop();
                        emitError
                        (
                            XMLErrs::EndedWithTagsOnStack
                            , topElem->fThisElement->getFullName()
                        );
                    }

                    // Its the end of file, so clear the got data flag
                    gotData = false;
                    continue;
                }

                // We are in some sort of markup now
                inMarkup = true;

                //  According to the token we got, call the appropriate
                //  scanning method.
                switch(curToken)
                {
                    case Token_CData :
                        // Make sure we are within content
                        if (fElemStack.isEmpty())
                            emitError(XMLErrs::CDATAOutsideOfContent);
                        scanCDSection();
                        break;

                    case Token_Comment :
                        scanComment();
                        break;

                    case Token_EndTag :
                        scanEndTag(gotData);
                        break;

                    case Token_PI :
                        scanPI();
                        break;

                    case Token_StartTag :
                        if (fDoNamespaces)
                            scanStartTagNS(gotData);
                        else
                            scanStartTag(gotData);
                        break;

                    default :
                        fReaderMgr.skipToChar(chOpenAngle);
                        break;
                }

                if (orgReader != fReaderMgr.getCurrentReaderNum())
                    emitError(XMLErrs::PartialMarkupInEntity);

                // And we are back out of markup again
                inMarkup = false;
            }
        }
        catch(const EndOfEntityException& toCatch)
        {
            //  If we were in some markup when this happened, then its a
            //  partial markup error.
            if (inMarkup)
                emitError(XMLErrs::PartialMarkupInEntity);

            // Send an end of entity reference event
            if (fDocHandler)
                fDocHandler->endEntityReference(toCatch.getEntity());

            inMarkup = false;
        }
    }

    // It went ok, so return success
    return true;
}